

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::SDLGraphicsSystem::throwOnInvalidTextureOperation
          (SDLGraphicsSystem *this,TextureId *id)

{
  uint uVar1;
  runtime_error *prVar2;
  size_type sVar3;
  uint *puVar4;
  TextureId *id_local;
  SDLGraphicsSystem *this_local;
  
  if ((this->isWindowCreated & 1U) == 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Cannot operate on textures when window not created");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = id->t;
  sVar3 = std::
          vector<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
          ::size(&this->textures);
  if (sVar3 <= uVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    puVar4 = TextureId::operator_cast_to_unsigned_int_(id);
    std::runtime_error::runtime_error(prVar2,"Unknown texture id: " + *puVar4);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void SDLGraphicsSystem::throwOnInvalidTextureOperation(const TextureId id) const {
    if (not isWindowCreated)
        throw std::runtime_error {"Cannot operate on textures when window not created"};

    if (id.t >= textures.size())
        throw std::runtime_error {"Unknown texture id: " + id};
}